

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

double ON_BoundingBoxTolerance(int dim,double *bboxmin,double *bboxmax)

{
  double dVar1;
  double local_40;
  double tolerance;
  double x;
  int i;
  double *bboxmax_local;
  double *bboxmin_local;
  double dStack_10;
  int dim_local;
  
  if (((dim < 1) || (bboxmin == (double *)0x0)) || (bboxmax == (double *)0x0)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_bounding_box.cpp"
               ,0xc09,"","dim > 0 && bboxmin != nullptr && bboxmax != nullptr is false");
    dStack_10 = 0.0;
  }
  else {
    for (x._4_4_ = 0; x._4_4_ < dim; x._4_4_ = x._4_4_ + 1) {
      if (bboxmax[x._4_4_] < bboxmin[x._4_4_]) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_bounding_box.cpp"
                   ,0xc0b,"","bboxmin[i] <= bboxmax[i] is false");
        return 0.0;
      }
    }
    local_40 = ON_ArrayDistance(dim,bboxmin,bboxmax);
    local_40 = local_40 * 2.220446049250313e-16;
    for (x._4_4_ = 0; x._4_4_ < dim; x._4_4_ = x._4_4_ + 1) {
      dVar1 = (bboxmax[x._4_4_] - bboxmin[x._4_4_]) * 1.490116119385e-08;
      if (local_40 < dVar1) {
        local_40 = dVar1;
      }
      dVar1 = (ABS(bboxmax[x._4_4_]) - ABS(bboxmin[x._4_4_])) * 2.220446049250313e-16;
      if (local_40 < dVar1) {
        local_40 = dVar1;
      }
    }
    if ((0.0 < local_40) && (local_40 < 2.3283064365386963e-10)) {
      local_40 = 2.3283064365386963e-10;
    }
    dStack_10 = local_40;
  }
  return dStack_10;
}

Assistant:

double ON_BoundingBoxTolerance(
        int dim,
        const double* bboxmin,
        const double* bboxmax
        )
{
  int i;
  double x, tolerance=0.0;

#if defined(ON_COMPILER_MSC)
#pragma ON_PRAGMA_WARNING_PUSH
// Disable the MSC /W4 "conditional expression is constant" warning
// generated by the do {...} while(0) in the ON_ASSERT_OR_RETURN macro.
#pragma ON_PRAGMA_WARNING_DISABLE_MSC( 4127 )
#endif

  ON_ASSERT_OR_RETURN( dim > 0 && bboxmin != nullptr && bboxmax != nullptr,tolerance);
  for ( i = 0; i < dim; i++ ) {
    ON_ASSERT_OR_RETURN(bboxmin[i] <= bboxmax[i],tolerance);
  }

#if defined(ON_COMPILER_MSC)
#pragma ON_PRAGMA_WARNING_POP
#endif

  tolerance = ON_ArrayDistance(dim,bboxmin,bboxmax)*ON_EPSILON;
  for ( i = 0; i < dim; i++ ) {
    x = (bboxmax[i] - bboxmin[i])*ON_SQRT_EPSILON;
    if ( x > tolerance )
      tolerance = x;
    x = (fabs(bboxmax[i]) - fabs(bboxmin[i]))*ON_EPSILON;
    if ( x > tolerance )
      tolerance = x;
  }
  if ( tolerance > 0.0 && tolerance < ON_ZERO_TOLERANCE )
    tolerance = ON_ZERO_TOLERANCE;
  return tolerance;
}